

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kkt.c
# Opt level: O0

void update_KKT_P(csc *KKT,csc *P,c_int *PtoKKT,c_float param1,c_int *Pdiag_idx,c_int Pdiag_n)

{
  c_int j;
  c_int i;
  c_int Pdiag_n_local;
  c_int *Pdiag_idx_local;
  c_float param1_local;
  c_int *PtoKKT_local;
  csc *P_local;
  csc *KKT_local;
  
  for (i = 0; i < P->p[P->n]; i = i + 1) {
    KKT->x[PtoKKT[i]] = P->x[i];
  }
  for (i = 0; i < Pdiag_n; i = i + 1) {
    KKT->x[PtoKKT[Pdiag_idx[i]]] = param1 + KKT->x[PtoKKT[Pdiag_idx[i]]];
  }
  return;
}

Assistant:

void update_KKT_P(csc          *KKT,
                  const csc    *P,
                  const c_int  *PtoKKT,
                  const c_float param1,
                  const c_int  *Pdiag_idx,
                  const c_int   Pdiag_n) {
  c_int i, j; // Iterations

  // Update elements of KKT using P
  for (i = 0; i < P->p[P->n]; i++) {
    KKT->x[PtoKKT[i]] = P->x[i];
  }

  // Update diagonal elements of KKT by adding sigma
  for (i = 0; i < Pdiag_n; i++) {
    j                  = Pdiag_idx[i]; // Extract index of the element on the
                                       // diagonal
    KKT->x[PtoKKT[j]] += param1;
  }
}